

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode Curl_http_readwrite_headers
                   (Curl_easy *data,connectdata *conn,ssize_t *nread,_Bool *stop_reading)

{
  SingleRequest *k;
  undefined1 *puVar1;
  int *piVar2;
  curl_off_t *pcVar3;
  ushort uVar4;
  uint uVar5;
  curlntlm cVar6;
  int iVar7;
  size_t __n;
  bool bVar8;
  _Bool _Var9;
  byte bVar10;
  CURLcode CVar11;
  statusline sVar12;
  int iVar13;
  int iVar14;
  CURLofft CVar15;
  char *pcVar16;
  long lVar17;
  char *pcVar18;
  time_t tVar19;
  size_t sVar20;
  byte *str;
  connectdata *pcVar21;
  CURLcode unaff_R15D;
  char separator;
  connectdata *local_78;
  int httpversion_major;
  int *local_68;
  int *local_60;
  _Bool *local_58;
  curl_off_t *local_50;
  int *local_48;
  char *local_40;
  ssize_t local_38;
  
  k = &data->req;
  local_38 = *nread;
  local_40 = (data->req).str;
  local_68 = &conn->httpversion;
  local_60 = &(data->req).httpcode;
  local_48 = &conn->rtspversion;
  local_50 = &(data->req).offset;
  local_78 = conn;
  local_58 = stop_reading;
  do {
    pcVar18 = (data->req).str;
    (data->req).str_start = pcVar18;
    __n = *nread;
    pcVar16 = (char *)memchr(pcVar18,10,__n);
    (data->req).end_ptr = pcVar16;
    if (pcVar16 == (char *)0x0) {
      CVar11 = header_append(data,k,__n);
      if (CVar11 != CURLE_OK) goto LAB_004beb6f;
      iVar14 = 2;
      if (((data->req).headerline == 0) &&
         (sVar12 = checkhttpprefix(data,(data->state).headerbuff,(data->req).hbuflen),
         sVar12 == STATUS_BAD)) {
        puVar1 = &(data->req).field_0x570;
        *puVar1 = *puVar1 & 0xfe;
        (data->req).badheader = HEADER_ALLBAD;
        iVar14 = 2;
        Curl_conncontrol(local_78,2);
        if ((*(ulong *)&(data->set).field_0x878 & 0x200000000000000) == 0) {
          Curl_failf(data,"Received HTTP/0.9 when not allowed\n");
LAB_004bef13:
          iVar14 = 1;
          unaff_R15D = CURLE_UNSUPPORTED_PROTOCOL;
        }
      }
    }
    else {
      *nread = (ssize_t)(pcVar18 + ~(ulong)pcVar16 + __n);
      (data->req).str = pcVar16 + 1;
      CVar11 = header_append(data,k,(long)(pcVar16 + 1) - (long)pcVar18);
      if (CVar11 != CURLE_OK) goto LAB_004beb6f;
      (data->req).end_ptr = (data->req).hbufp;
      pcVar18 = (data->state).headerbuff;
      (data->req).p = pcVar18;
      if ((data->req).headerline == 0) {
        sVar12 = checkhttpprefix(data,pcVar18,(data->req).hbuflen);
        iVar14 = 0;
        if (sVar12 == STATUS_BAD) {
          Curl_conncontrol(local_78,2);
          if ((*(ulong *)&(data->set).field_0x878 & 0x200000000000000) == 0) {
            Curl_failf(data,"Received HTTP/0.9 when not allowed\n");
            iVar14 = 1;
            unaff_R15D = CURLE_UNSUPPORTED_PROTOCOL;
          }
          else {
            puVar1 = &(data->req).field_0x570;
            *puVar1 = *puVar1 & 0xfe;
            if (*nread == 0) {
              (data->req).badheader = HEADER_ALLBAD;
              *nread = local_38;
              (data->req).str = local_40;
              unaff_R15D = CURLE_OK;
              iVar14 = 1;
            }
            else {
              (data->req).badheader = HEADER_PARTHEADER;
              iVar14 = 2;
            }
          }
        }
        if (sVar12 == STATUS_BAD) goto LAB_004beb72;
      }
      pcVar21 = local_78;
      pcVar18 = (data->req).p;
      if (*pcVar18 == '\n') {
LAB_004bec98:
        pcVar18 = (data->req).p;
        if (*pcVar18 == '\n') {
          (data->req).p = pcVar18 + 1;
        }
        uVar5 = (data->req).httpcode;
        if (uVar5 - 100 < 100) {
          if ((char)uVar5 == 'e') {
            if ((data->req).upgr101 == UPGR101_REQUESTED) {
              Curl_infof(data,"Received 101\n");
              (data->req).upgr101 = UPGR101_RECEIVED;
              puVar1 = &(data->req).field_0x570;
              *puVar1 = *puVar1 | 1;
              (data->req).headerline = 0;
              goto LAB_004bef13;
            }
            puVar1 = &(data->req).field_0x570;
            *puVar1 = *puVar1 & 0xfe;
          }
          else if ((uVar5 & 0xff) == 100) {
            puVar1 = &(data->req).field_0x570;
            *puVar1 = *puVar1 | 1;
            (data->req).headerline = 0;
            if ((data->req).exp100 != EXP100_SEND_DATA) {
              (data->req).exp100 = EXP100_SEND_DATA;
              piVar2 = &(data->req).keepon;
              *(byte *)piVar2 = (byte)*piVar2 | 2;
              Curl_expire_done(data,EXPIRE_100_TIMEOUT);
            }
          }
          else {
            puVar1 = &(data->req).field_0x570;
            *puVar1 = *puVar1 | 1;
            (data->req).headerline = 0;
          }
        }
        else {
          uVar4 = *(ushort *)&(data->req).field_0x570;
          *(ushort *)&(data->req).field_0x570 = uVar4 & 0xfffe;
          if (((((uVar4 & 0x20) == 0 && (data->req).size == -1) &&
               (((local_78->bits).field_0x4 & 1) == 0)) && (local_78->httpversion == 0xb)) &&
             (((local_78->handler->protocol & 0x40000) == 0 && ((data->set).httpreq != HTTPREQ_HEAD)
              ))) {
            Curl_infof(data,"no chunk, no close, no size. Assume close to signal end\n");
            Curl_conncontrol(pcVar21,2);
          }
        }
        if (((pcVar21->bits).field_0x4 & 1) != 0) {
          iVar14 = (data->req).httpcode;
          if (iVar14 == 0x197) {
            cVar6 = pcVar21->proxy_ntlm_state;
          }
          else {
            if (iVar14 != 0x191) goto LAB_004bef95;
            cVar6 = pcVar21->http_ntlm_state;
          }
          if (cVar6 == NTLMSTATE_TYPE2) {
            Curl_infof(data,"Connection closure while negotiating auth (HTTP 1.0?)\n");
            puVar1 = &(data->state).field_0x4e4;
            *puVar1 = *puVar1 | 0x20;
          }
        }
LAB_004bef95:
        iVar14 = http_should_fail(pcVar21);
        if (iVar14 != 0) {
          Curl_failf(data,"The requested URL returned error: %d",(ulong)(uint)(data->req).httpcode);
          unaff_R15D = CURLE_HTTP_RETURNED_ERROR;
LAB_004befc0:
          iVar14 = 1;
          goto LAB_004beb72;
        }
        pcVar18 = (data->state).headerbuff;
        sVar20 = (long)(data->req).p - (long)pcVar18;
        CVar11 = Curl_client_write(pcVar21,((*(uint *)&(data->set).field_0x878 >> 0x19 & 1) != 0) +
                                           2,pcVar18,sVar20);
        if (CVar11 == CURLE_OK) {
          pcVar3 = &(data->info).header_size;
          *pcVar3 = *pcVar3 + sVar20;
          lVar17 = (data->req).headerbytecount + sVar20;
          (data->req).headerbytecount = lVar17;
          if (99 < (data->req).httpcode - 100U) {
            lVar17 = 0;
          }
          (data->req).deductheadercount = lVar17;
          CVar11 = Curl_http_auth_act(pcVar21);
          if (CVar11 == CURLE_OK) {
            if (299 < (data->req).httpcode) {
              if ((((*(uint *)&(pcVar21->bits).field_0x4 & 0x18001) == 0) &&
                  ((data->set).httpreq - HTTPREQ_POST < 4)) &&
                 (Curl_expire_done(data,EXPIRE_100_TIMEOUT), ((data->req).field_0x570 & 4) == 0)) {
                if (((data->set).field_0x87a & 0x20) == 0) {
                  Curl_infof(data,"HTTP error before end of send, stop sending\n");
                  Curl_conncontrol(pcVar21,2);
                  puVar1 = &(data->req).field_0x570;
                  *puVar1 = *puVar1 | 4;
                  piVar2 = &(data->req).keepon;
                  *(byte *)piVar2 = (byte)*piVar2 & 0xfd;
                  if (((data->state).field_0x4e5 & 1) != 0) {
                    (data->req).exp100 = EXP100_FAILED;
                  }
                }
                else {
                  Curl_infof(data,"HTTP error before end of send, keep sending\n");
                  if ((data->req).exp100 != EXP100_SEND_DATA) {
                    (data->req).exp100 = EXP100_SEND_DATA;
                    piVar2 = &(data->req).keepon;
                    *(byte *)piVar2 = (byte)*piVar2 | 2;
                  }
                }
              }
              if (((pcVar21->bits).field_0x6 & 1) != 0) {
                Curl_infof(data,"Keep sending data to get tossed away!\n");
                piVar2 = &(data->req).keepon;
                *(byte *)piVar2 = (byte)*piVar2 | 2;
              }
            }
            uVar4 = *(ushort *)&(data->req).field_0x570;
            if ((uVar4 & 1) == 0) {
              if (((data->set).field_0x87b & 0x10) == 0) {
                if ((uVar4 & 0x20) != 0) {
                  *(undefined4 *)&k->size = 0xffffffff;
                  *(undefined4 *)((long)&(data->req).size + 4) = 0xffffffff;
                  *(undefined4 *)&(data->req).maxdownload = 0xffffffff;
                  *(undefined4 *)((long)&(data->req).maxdownload + 4) = 0xffffffff;
                }
              }
              else {
                *local_58 = true;
              }
              if (k->size != -1) {
                Curl_pgrsSetDownloadSize(data,k->size);
                (data->req).maxdownload = (data->req).size;
              }
              if ((data->req).maxdownload == 0) {
                *local_58 = true;
              }
              if (*local_58 == true) {
                piVar2 = &(data->req).keepon;
                *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
              }
              iVar14 = 2;
              if (((data->set).field_0x87b & 0x40) != 0) {
                Curl_debug(data,CURLINFO_HEADER_IN,(data->req).str_start,sVar20);
              }
            }
            else {
              (data->req).hbufp = (data->state).headerbuff;
              (data->req).hbuflen = 0;
              iVar14 = 3;
            }
            goto LAB_004beb72;
          }
        }
      }
      else {
        if (*pcVar18 == '\r') {
          (data->req).p = pcVar18 + 1;
          goto LAB_004bec98;
        }
        iVar14 = (data->req).headerline;
        (data->req).headerline = iVar14 + 1;
        if (iVar14 == 0) {
          uVar5 = local_78->handler->protocol;
          if ((uVar5 & 3) == 0) {
            iVar14 = 0;
            if ((uVar5 >> 0x12 & 1) != 0) {
              iVar14 = 0;
              iVar13 = __isoc99_sscanf(pcVar18," RTSP/%1d.%1d%c%3d",&httpversion_major,local_48,
                                       &separator,local_60);
              if ((iVar13 == 4) && (separator == ' ')) {
                pcVar21->rtspversion = pcVar21->rtspversion + httpversion_major * 10;
                pcVar21->httpversion = 0xb;
                iVar14 = 4;
              }
            }
LAB_004bf1f7:
            if (iVar14 == 0) {
              puVar1 = &(data->req).field_0x570;
              *puVar1 = *puVar1 & 0xfe;
              iVar14 = 2;
              goto LAB_004bf301;
            }
            iVar14 = (data->req).httpcode;
            (data->info).httpcode = iVar14;
            iVar13 = pcVar21->httpversion;
            (data->info).httpversion = iVar13;
            iVar7 = (data->state).httpversion;
            if (iVar13 < iVar7 || iVar7 == 0) {
              (data->state).httpversion = iVar13;
            }
            if (((data->state).resume_from == 0) ||
               (iVar14 != 0x1a0 || (data->set).httpreq != HTTPREQ_GET)) {
              if ((399 < iVar14 & (byte)(data->set).field_0x87a >> 4) == 1) {
                if (iVar14 == 0x197) {
                  bVar10 = (pcVar21->bits).field_0x5 & 1;
joined_r0x004bf2ac:
                  if (bVar10 != 0) goto LAB_004bf2c3;
                }
                else if (iVar14 == 0x191) {
                  bVar10 = (pcVar21->bits).field_0x4 & 0x80;
                  goto joined_r0x004bf2ac;
                }
                print_http_error(data);
                unaff_R15D = CURLE_HTTP_RETURNED_ERROR;
                goto LAB_004bf2bc;
              }
            }
            else {
              puVar1 = &(data->req).field_0x570;
              *puVar1 = *puVar1 | 8;
            }
LAB_004bf2c3:
            if (pcVar21->httpversion == 0x14) {
LAB_004bf317:
              pcVar21->bundle->multiuse = 2;
            }
            else if (pcVar21->httpversion == 10) {
              Curl_infof(data,"HTTP 1.0, assume close after body\n");
              Curl_conncontrol(pcVar21,1);
            }
            else if (iVar14 == 0x65 && (data->req).upgr101 == UPGR101_REQUESTED) goto LAB_004bf317;
            iVar13 = (data->req).httpcode;
            iVar14 = 0;
            bVar8 = true;
            if (iVar13 == 0xcc) {
LAB_004bf354:
              k->size = 0;
              k->maxdownload = 0;
              puVar1 = &(data->req).field_0x570;
              *puVar1 = *puVar1 | 0x10;
            }
            else if (iVar13 == 0x130) {
              if ((data->set).timecondition != CURL_TIMECOND_NONE) {
                puVar1 = &(data->info).field_0xe0;
                *puVar1 = *puVar1 | 1;
              }
              goto LAB_004bf354;
            }
          }
          else {
            iVar14 = __isoc99_sscanf(pcVar18," HTTP/%1d.%1d%c%3d",&httpversion_major,local_68,
                                     &separator,local_60);
            if ((iVar14 == 1) && (httpversion_major == 2)) {
              iVar13 = __isoc99_sscanf((data->req).p," HTTP/2 %d",local_60);
              iVar14 = 1;
              if (iVar13 == 1) {
                *local_68 = 0;
                separator = ' ';
                iVar14 = 4;
              }
            }
            if ((iVar14 == 4) && (separator == ' ')) {
              iVar14 = httpversion_major * 10 + *local_68;
              *local_68 = iVar14;
              if (iVar14 != 0x14 && (data->req).upgr101 == UPGR101_RECEIVED) {
                Curl_infof(data,"Lying server, not serving HTTP/2\n");
              }
              bVar8 = true;
              iVar14 = 4;
              if (*local_68 < 0x14) {
                local_78->bundle->multiuse = -1;
                Curl_infof(data,"Mark bundle as not supporting multiuse\n");
              }
            }
            else if (iVar14 == 0) {
              iVar14 = __isoc99_sscanf((data->req).p," HTTP %3d",local_60);
              *local_68 = 10;
              bVar8 = true;
              if (iVar14 == 0) {
                sVar12 = checkhttpprefix(data,(data->req).p,(data->req).hbuflen);
                iVar14 = 0;
                if (sVar12 == STATUS_DONE) {
                  *local_60 = 200;
                  *local_68 = 10;
                  iVar14 = 1;
                }
              }
            }
            else {
              bVar8 = false;
              Curl_failf(data,"Unsupported HTTP version in response\n");
              unaff_R15D = CURLE_UNSUPPORTED_PROTOCOL;
            }
            pcVar21 = local_78;
            if (bVar8) goto LAB_004bf1f7;
LAB_004bf2bc:
            iVar14 = 1;
LAB_004bf301:
            bVar8 = false;
          }
          if (!bVar8) goto LAB_004beb72;
        }
        if (((((data->req).field_0x570 & 0x10) == 0) && (((data->set).field_0x87c & 0x10) == 0)) &&
           (iVar14 = curl_strnequal("Content-Length:",(data->req).p,0xf), iVar14 != 0)) {
          CVar15 = curlx_strtoofft((data->req).p + 0xf,(char **)0x0,10,
                                   (curl_off_t *)&httpversion_major);
          if (CVar15 == CURL_OFFT_FLOW) {
            if ((data->set).max_filesize == 0) {
              Curl_conncontrol(local_78,2);
              Curl_infof(data,"Overflow Content-Length: value!\n");
              goto LAB_004bf6d7;
            }
LAB_004bf5f0:
            bVar8 = false;
            Curl_failf(data,"Maximum file size exceeded");
            unaff_R15D = CURLE_FILESIZE_EXCEEDED;
          }
          else if (CVar15 == CURL_OFFT_OK) {
            lVar17 = (data->set).max_filesize;
            if (lVar17 < _httpversion_major && lVar17 != 0) goto LAB_004bf5f0;
            (data->req).size = _httpversion_major;
            (data->req).maxdownload = _httpversion_major;
            Curl_pgrsSetDownloadSize(data,_httpversion_major);
LAB_004bf6d7:
            bVar8 = true;
          }
          else {
            bVar8 = false;
            Curl_failf(data,"Invalid Content-Length: value");
            unaff_R15D = CURLE_WEIRD_SERVER_REPLY;
          }
          if (bVar8) goto LAB_004bf8dc;
          goto LAB_004befc0;
        }
        iVar14 = curl_strnequal("Content-Type:",(data->req).p,0xd);
        pcVar21 = local_78;
        if (iVar14 != 0) {
          pcVar18 = Curl_copy_header_value((data->req).p);
          if (pcVar18 == (char *)0x0) {
LAB_004bf8cd:
            unaff_R15D = CURLE_OUT_OF_MEMORY;
          }
          else if (*pcVar18 == '\0') {
            (*Curl_cfree)(pcVar18);
          }
          else {
            (*Curl_cfree)((data->info).contenttype);
            (data->info).contenttype = pcVar18;
          }
LAB_004bf8d3:
          if (pcVar18 != (char *)0x0) goto LAB_004bf8dc;
          goto LAB_004befc0;
        }
        if (((local_78->httpversion == 10) && (((local_78->bits).field_0x4 & 0x20) != 0)) &&
           (_Var9 = Curl_compareheader((data->req).p,"Proxy-Connection:","keep-alive"), _Var9)) {
          Curl_conncontrol(pcVar21,0);
          pcVar18 = "HTTP/1.0 proxy connection set to keep alive!\n";
LAB_004bf552:
          Curl_infof(data,pcVar18);
LAB_004bf8dc:
          uVar5 = *(uint *)&(data->set).field_0x878;
          if ((uVar5 >> 0x1e & 1) != 0) {
            Curl_debug(data,CURLINFO_HEADER_IN,(data->req).p,(data->req).hbuflen);
          }
          CVar11 = Curl_client_write(local_78,((uVar5 >> 0x19 & 1) != 0) + 2,(data->req).p,
                                     (data->req).hbuflen);
          if (CVar11 == CURLE_OK) {
            sVar20 = (data->req).hbuflen;
            pcVar3 = &(data->info).header_size;
            *pcVar3 = *pcVar3 + sVar20;
            pcVar3 = &(data->req).headerbytecount;
            *pcVar3 = *pcVar3 + sVar20;
            (data->req).hbufp = (data->state).headerbuff;
            (data->req).hbuflen = 0;
            iVar14 = 0;
            goto LAB_004beb72;
          }
        }
        else {
          if (((pcVar21->httpversion == 0xb) && (((pcVar21->bits).field_0x4 & 0x20) != 0)) &&
             (_Var9 = Curl_compareheader((data->req).p,"Proxy-Connection:","close"), _Var9)) {
            Curl_conncontrol(pcVar21,1);
            pcVar18 = "HTTP/1.1 proxy connection set close!\n";
            goto LAB_004bf552;
          }
          if ((pcVar21->httpversion == 10) &&
             (_Var9 = Curl_compareheader((data->req).p,"Connection:","keep-alive"), _Var9)) {
            Curl_conncontrol(pcVar21,0);
            pcVar18 = "HTTP/1.0 connection set to keep alive!\n";
            goto LAB_004bf552;
          }
          _Var9 = Curl_compareheader((data->req).p,"Connection:","close");
          if (_Var9) {
            Curl_conncontrol(pcVar21,2);
            goto LAB_004bf8dc;
          }
          iVar14 = curl_strnequal("Transfer-Encoding:",(data->req).p,0x12);
          pcVar18 = (data->req).p;
          if (iVar14 == 0) {
            iVar14 = curl_strnequal("Content-Encoding:",pcVar18,0x11);
            if ((iVar14 == 0) || ((data->set).str[9] == (char *)0x0)) {
              iVar14 = curl_strnequal("Content-Range:",(data->req).p,0xe);
              if (iVar14 == 0) {
                if ((data->cookies == (CookieInfo *)0x0) ||
                   (iVar14 = curl_strnequal("Set-Cookie:",(data->req).p,0xb), iVar14 == 0)) {
                  iVar14 = curl_strnequal("Last-Modified:",(data->req).p,0xe);
                  if ((iVar14 == 0) ||
                     (((data->set).timecondition == CURL_TIMECOND_NONE &&
                      (((data->set).field_0x879 & 2) == 0)))) {
                    iVar14 = curl_strnequal("WWW-Authenticate:",(data->req).p,0x11);
                    if (((iVar14 != 0) && ((data->req).httpcode == 0x191)) ||
                       ((iVar14 = curl_strnequal("Proxy-authenticate:",(data->req).p,0x13),
                        iVar14 != 0 && ((data->req).httpcode == 0x197)))) {
                      iVar14 = (data->req).httpcode;
                      pcVar18 = Curl_copy_header_value((data->req).p);
                      if (pcVar18 == (char *)0x0) goto LAB_004bf8cd;
                      Curl_http_input_auth(local_78,iVar14 == 0x197,pcVar18);
                      (*Curl_cfree)(pcVar18);
                      goto LAB_004bf8d3;
                    }
                    if ((((data->req).httpcode - 300U < 100) &&
                        (iVar14 = curl_strnequal("Location:",(data->req).p,9), iVar14 != 0)) &&
                       ((data->req).location == (char *)0x0)) {
                      pcVar18 = Curl_copy_header_value((data->req).p);
                      if (pcVar18 == (char *)0x0) {
LAB_004bfb93:
                        bVar8 = false;
                        unaff_R15D = CURLE_OUT_OF_MEMORY;
                      }
                      else {
                        if (*pcVar18 == '\0') {
                          (*Curl_cfree)(pcVar18);
                        }
                        else {
                          (data->req).location = pcVar18;
                          if (((data->set).field_0x87a & 0x40) != 0) {
                            pcVar18 = (*Curl_cstrdup)(pcVar18);
                            (data->req).newurl = pcVar18;
                            if (pcVar18 == (char *)0x0) goto LAB_004bfb93;
                            CVar11 = http_perhapsrewind(local_78);
                            if (CVar11 != CURLE_OK) {
                              bVar8 = false;
                              unaff_R15D = CVar11;
                              goto LAB_004bfbab;
                            }
                          }
                        }
                        bVar8 = true;
                      }
LAB_004bfbab:
                      if (!bVar8) goto LAB_004befc0;
                    }
                    else if ((pcVar21->handler->protocol & 0x40000) != 0) {
                      iVar14 = 1;
                      unaff_R15D = CURLE_NOT_BUILT_IN;
                      goto LAB_004beb72;
                    }
                  }
                  else {
                    _httpversion_major = time((time_t *)0x0);
                    tVar19 = curl_getdate((data->req).p + 0xe,(time_t *)&httpversion_major);
                    (data->req).timeofdoc = tVar19;
                    if (((data->set).field_0x879 & 2) != 0) {
                      (data->info).filetime = tVar19;
                    }
                  }
                }
                else {
                  Curl_share_lock(data,CURL_LOCK_DATA_COOKIE,CURL_LOCK_ACCESS_SINGLE);
                  pcVar18 = (pcVar21->allocptr).cookiehost;
                  if (pcVar18 == (char *)0x0) {
                    pcVar18 = (pcVar21->host).name;
                  }
                  Curl_cookie_add(data,data->cookies,true,false,(data->req).p + 0xb,pcVar18,
                                  (data->state).up.path,
                                  SUB41((pcVar21->handler->protocol & 2) >> 1,0));
                  Curl_share_unlock(data,CURL_LOCK_DATA_COOKIE);
                }
              }
              else {
                pcVar18 = (data->req).p;
                bVar10 = pcVar18[0xe];
                for (str = (byte *)(pcVar18 + 0xe);
                    ((bVar10 != 0 && (iVar14 = Curl_isdigit((uint)bVar10), iVar14 == 0)) &&
                    (*str != 0x2a)); str = str + 1) {
                  bVar10 = str[1];
                }
                iVar14 = Curl_isdigit((uint)*str);
                if (iVar14 == 0) {
                  (data->state).resume_from = 0;
                }
                else {
                  CVar15 = curlx_strtoofft((char *)str,(char **)0x0,10,local_50);
                  if ((CVar15 == CURL_OFFT_OK) && ((data->state).resume_from == (data->req).offset))
                  {
                    puVar1 = &(data->req).field_0x570;
                    *puVar1 = *puVar1 | 2;
                  }
                }
              }
            }
            else {
              CVar11 = Curl_build_unencoding_stack(pcVar21,(data->req).p + 0x11,0);
              if (CVar11 != CURLE_OK) goto LAB_004beb6f;
            }
            goto LAB_004bf8dc;
          }
          CVar11 = Curl_build_unencoding_stack(pcVar21,pcVar18 + 0x12,1);
          if (CVar11 == CURLE_OK) goto LAB_004bf8dc;
        }
      }
LAB_004beb6f:
      iVar14 = 1;
      unaff_R15D = CVar11;
    }
LAB_004beb72:
    if ((iVar14 != 0) && (iVar14 != 3)) {
      if (iVar14 == 2) {
        return CURLE_OK;
      }
      return unaff_R15D;
    }
    if (*(data->req).str == '\0') {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

CURLcode Curl_http_readwrite_headers(struct Curl_easy *data,
                                       struct connectdata *conn,
                                       ssize_t *nread,
                                       bool *stop_reading)
{
  CURLcode result;
  struct SingleRequest *k = &data->req;
  ssize_t onread = *nread;
  char *ostr = k->str;

  /* header line within buffer loop */
  do {
    size_t rest_length;
    size_t full_length;
    int writetype;

    /* str_start is start of line within buf */
    k->str_start = k->str;

    /* data is in network encoding so use 0x0a instead of '\n' */
    k->end_ptr = memchr(k->str_start, 0x0a, *nread);

    if(!k->end_ptr) {
      /* Not a complete header line within buffer, append the data to
         the end of the headerbuff. */
      result = header_append(data, k, *nread);
      if(result)
        return result;

      if(!k->headerline) {
        /* check if this looks like a protocol header */
        statusline st = checkprotoprefix(data, conn, data->state.headerbuff,
                                         k->hbuflen);
        if(st == STATUS_BAD) {
          /* this is not the beginning of a protocol first header line */
          k->header = FALSE;
          k->badheader = HEADER_ALLBAD;
          streamclose(conn, "bad HTTP: No end-of-message indicator");
          if(!data->set.http09_allowed) {
            failf(data, "Received HTTP/0.9 when not allowed\n");
            return CURLE_UNSUPPORTED_PROTOCOL;
          }
          break;
        }
      }

      break; /* read more and try again */
    }

    /* decrease the size of the remaining (supposed) header line */
    rest_length = (k->end_ptr - k->str) + 1;
    *nread -= (ssize_t)rest_length;

    k->str = k->end_ptr + 1; /* move past new line */

    full_length = k->str - k->str_start;

    result = header_append(data, k, full_length);
    if(result)
      return result;

    k->end_ptr = k->hbufp;
    k->p = data->state.headerbuff;

    /****
     * We now have a FULL header line that p points to
     *****/

    if(!k->headerline) {
      /* the first read header */
      statusline st = checkprotoprefix(data, conn, data->state.headerbuff,
                                       k->hbuflen);
      if(st == STATUS_BAD) {
        streamclose(conn, "bad HTTP: No end-of-message indicator");
        /* this is not the beginning of a protocol first header line */
        if(!data->set.http09_allowed) {
          failf(data, "Received HTTP/0.9 when not allowed\n");
          return CURLE_UNSUPPORTED_PROTOCOL;
        }
        k->header = FALSE;
        if(*nread)
          /* since there's more, this is a partial bad header */
          k->badheader = HEADER_PARTHEADER;
        else {
          /* this was all we read so it's all a bad header */
          k->badheader = HEADER_ALLBAD;
          *nread = onread;
          k->str = ostr;
          return CURLE_OK;
        }
        break;
      }
    }

    /* headers are in network encoding so
       use 0x0a and 0x0d instead of '\n' and '\r' */
    if((0x0a == *k->p) || (0x0d == *k->p)) {
      size_t headerlen;
      /* Zero-length header line means end of headers! */

#ifdef CURL_DOES_CONVERSIONS
      if(0x0d == *k->p) {
        *k->p = '\r'; /* replace with CR in host encoding */
        k->p++;       /* pass the CR byte */
      }
      if(0x0a == *k->p) {
        *k->p = '\n'; /* replace with LF in host encoding */
        k->p++;       /* pass the LF byte */
      }
#else
      if('\r' == *k->p)
        k->p++; /* pass the \r byte */
      if('\n' == *k->p)
        k->p++; /* pass the \n byte */
#endif /* CURL_DOES_CONVERSIONS */

      if(100 <= k->httpcode && 199 >= k->httpcode) {
        /* "A user agent MAY ignore unexpected 1xx status responses." */
        switch(k->httpcode) {
        case 100:
          /*
           * We have made a HTTP PUT or POST and this is 1.1-lingo
           * that tells us that the server is OK with this and ready
           * to receive the data.
           * However, we'll get more headers now so we must get
           * back into the header-parsing state!
           */
          k->header = TRUE;
          k->headerline = 0; /* restart the header line counter */

          /* if we did wait for this do enable write now! */
          if(k->exp100 > EXP100_SEND_DATA) {
            k->exp100 = EXP100_SEND_DATA;
            k->keepon |= KEEP_SEND;
            Curl_expire_done(data, EXPIRE_100_TIMEOUT);
          }
          break;
        case 101:
          /* Switching Protocols */
          if(k->upgr101 == UPGR101_REQUESTED) {
            /* Switching to HTTP/2 */
            infof(data, "Received 101\n");
            k->upgr101 = UPGR101_RECEIVED;

            /* we'll get more headers (HTTP/2 response) */
            k->header = TRUE;
            k->headerline = 0; /* restart the header line counter */

            /* switch to http2 now. The bytes after response headers
               are also processed here, otherwise they are lost. */
            result = Curl_http2_switched(conn, k->str, *nread);
            if(result)
              return result;
            *nread = 0;
          }
          else {
            /* Switching to another protocol (e.g. WebSocket) */
            k->header = FALSE; /* no more header to parse! */
          }
          break;
        default:
          /* the status code 1xx indicates a provisional response, so
             we'll get another set of headers */
          k->header = TRUE;
          k->headerline = 0; /* restart the header line counter */
          break;
        }
      }
      else {
        k->header = FALSE; /* no more header to parse! */

        if((k->size == -1) && !k->chunk && !conn->bits.close &&
           (conn->httpversion == 11) &&
           !(conn->handler->protocol & CURLPROTO_RTSP) &&
           data->set.httpreq != HTTPREQ_HEAD) {
          /* On HTTP 1.1, when connection is not to get closed, but no
             Content-Length nor Transfer-Encoding chunked have been
             received, according to RFC2616 section 4.4 point 5, we
             assume that the server will close the connection to
             signal the end of the document. */
          infof(data, "no chunk, no close, no size. Assume close to "
                "signal end\n");
          streamclose(conn, "HTTP: No end-of-message indicator");
        }
      }

      /* At this point we have some idea about the fate of the connection.
         If we are closing the connection it may result auth failure. */
#if defined(USE_NTLM)
      if(conn->bits.close &&
         (((data->req.httpcode == 401) &&
           (conn->http_ntlm_state == NTLMSTATE_TYPE2)) ||
          ((data->req.httpcode == 407) &&
           (conn->proxy_ntlm_state == NTLMSTATE_TYPE2)))) {
        infof(data, "Connection closure while negotiating auth (HTTP 1.0?)\n");
        data->state.authproblem = TRUE;
      }
#endif
#if defined(USE_SPNEGO)
      if(conn->bits.close &&
        (((data->req.httpcode == 401) &&
          (conn->http_negotiate_state == GSS_AUTHRECV)) ||
         ((data->req.httpcode == 407) &&
          (conn->proxy_negotiate_state == GSS_AUTHRECV)))) {
        infof(data, "Connection closure while negotiating auth (HTTP 1.0?)\n");
        data->state.authproblem = TRUE;
      }
      if((conn->http_negotiate_state == GSS_AUTHDONE) &&
         (data->req.httpcode != 401)) {
        conn->http_negotiate_state = GSS_AUTHSUCC;
      }
      if((conn->proxy_negotiate_state == GSS_AUTHDONE) &&
         (data->req.httpcode != 407)) {
        conn->proxy_negotiate_state = GSS_AUTHSUCC;
      }
#endif
      /*
       * When all the headers have been parsed, see if we should give
       * up and return an error.
       */
      if(http_should_fail(conn)) {
        failf(data, "The requested URL returned error: %d",
              k->httpcode);
        return CURLE_HTTP_RETURNED_ERROR;
      }

      /* now, only output this if the header AND body are requested:
       */
      writetype = CLIENTWRITE_HEADER;
      if(data->set.include_header)
        writetype |= CLIENTWRITE_BODY;

      headerlen = k->p - data->state.headerbuff;

      result = Curl_client_write(conn, writetype,
                                 data->state.headerbuff,
                                 headerlen);
      if(result)
        return result;

      data->info.header_size += (long)headerlen;
      data->req.headerbytecount += (long)headerlen;

      data->req.deductheadercount =
        (100 <= k->httpcode && 199 >= k->httpcode)?data->req.headerbytecount:0;

      /* Curl_http_auth_act() checks what authentication methods
       * that are available and decides which one (if any) to
       * use. It will set 'newurl' if an auth method was picked. */
      result = Curl_http_auth_act(conn);

      if(result)
        return result;

      if(k->httpcode >= 300) {
        if((!conn->bits.authneg) && !conn->bits.close &&
           !conn->bits.rewindaftersend) {
          /*
           * General treatment of errors when about to send data. Including :
           * "417 Expectation Failed", while waiting for 100-continue.
           *
           * The check for close above is done simply because of something
           * else has already deemed the connection to get closed then
           * something else should've considered the big picture and we
           * avoid this check.
           *
           * rewindaftersend indicates that something has told libcurl to
           * continue sending even if it gets discarded
           */

          switch(data->set.httpreq) {
          case HTTPREQ_PUT:
          case HTTPREQ_POST:
          case HTTPREQ_POST_FORM:
          case HTTPREQ_POST_MIME:
            /* We got an error response. If this happened before the whole
             * request body has been sent we stop sending and mark the
             * connection for closure after we've read the entire response.
             */
            Curl_expire_done(data, EXPIRE_100_TIMEOUT);
            if(!k->upload_done) {
              if(data->set.http_keep_sending_on_error) {
                infof(data, "HTTP error before end of send, keep sending\n");
                if(k->exp100 > EXP100_SEND_DATA) {
                  k->exp100 = EXP100_SEND_DATA;
                  k->keepon |= KEEP_SEND;
                }
              }
              else {
                infof(data, "HTTP error before end of send, stop sending\n");
                streamclose(conn, "Stop sending data before everything sent");
                k->upload_done = TRUE;
                k->keepon &= ~KEEP_SEND; /* don't send */
                if(data->state.expect100header)
                  k->exp100 = EXP100_FAILED;
              }
            }
            break;

          default: /* default label present to avoid compiler warnings */
            break;
          }
        }

        if(conn->bits.rewindaftersend) {
          /* We rewind after a complete send, so thus we continue
             sending now */
          infof(data, "Keep sending data to get tossed away!\n");
          k->keepon |= KEEP_SEND;
        }
      }

      if(!k->header) {
        /*
         * really end-of-headers.
         *
         * If we requested a "no body", this is a good time to get
         * out and return home.
         */
        if(data->set.opt_no_body)
          *stop_reading = TRUE;
#ifndef CURL_DISABLE_RTSP
        else if((conn->handler->protocol & CURLPROTO_RTSP) &&
                (data->set.rtspreq == RTSPREQ_DESCRIBE) &&
                (k->size <= -1))
          /* Respect section 4.4 of rfc2326: If the Content-Length header is
             absent, a length 0 must be assumed.  It will prevent libcurl from
             hanging on DESCRIBE request that got refused for whatever
             reason */
          *stop_reading = TRUE;
#endif
        else {
          /* If we know the expected size of this document, we set the
             maximum download size to the size of the expected
             document or else, we won't know when to stop reading!

             Note that we set the download maximum even if we read a
             "Connection: close" header, to make sure that
             "Content-Length: 0" still prevents us from attempting to
             read the (missing) response-body.
          */
          /* According to RFC2616 section 4.4, we MUST ignore
             Content-Length: headers if we are now receiving data
             using chunked Transfer-Encoding.
          */
          if(k->chunk)
            k->maxdownload = k->size = -1;
        }
        if(-1 != k->size) {
          /* We do this operation even if no_body is true, since this
             data might be retrieved later with curl_easy_getinfo()
             and its CURLINFO_CONTENT_LENGTH_DOWNLOAD option. */

          Curl_pgrsSetDownloadSize(data, k->size);
          k->maxdownload = k->size;
        }

        /* If max download size is *zero* (nothing) we already have
           nothing and can safely return ok now!  But for HTTP/2, we'd
           like to call http2_handle_stream_close to properly close a
           stream.  In order to do this, we keep reading until we
           close the stream. */
        if(0 == k->maxdownload
#if defined(USE_NGHTTP2)
           && !((conn->handler->protocol & PROTO_FAMILY_HTTP) &&
                conn->httpversion == 20)
#endif
           )
          *stop_reading = TRUE;

        if(*stop_reading) {
          /* we make sure that this socket isn't read more now */
          k->keepon &= ~KEEP_RECV;
        }

        if(data->set.verbose)
          Curl_debug(data, CURLINFO_HEADER_IN,
                     k->str_start, headerlen);
        break;          /* exit header line loop */
      }

      /* We continue reading headers, so reset the line-based
         header parsing variables hbufp && hbuflen */
      k->hbufp = data->state.headerbuff;
      k->hbuflen = 0;
      continue;
    }

    /*
     * Checks for special headers coming up.
     */

    if(!k->headerline++) {
      /* This is the first header, it MUST be the error code line
         or else we consider this to be the body right away! */
      int httpversion_major;
      int rtspversion_major;
      int nc = 0;
#ifdef CURL_DOES_CONVERSIONS
#define HEADER1 scratch
#define SCRATCHSIZE 21
      CURLcode res;
      char scratch[SCRATCHSIZE + 1]; /* "HTTP/major.minor 123" */
      /* We can't really convert this yet because we
         don't know if it's the 1st header line or the body.
         So we do a partial conversion into a scratch area,
         leaving the data at k->p as-is.
      */
      strncpy(&scratch[0], k->p, SCRATCHSIZE);
      scratch[SCRATCHSIZE] = 0; /* null terminate */
      res = Curl_convert_from_network(data,
                                      &scratch[0],
                                      SCRATCHSIZE);
      if(res)
        /* Curl_convert_from_network calls failf if unsuccessful */
        return res;
#else
#define HEADER1 k->p /* no conversion needed, just use k->p */
#endif /* CURL_DOES_CONVERSIONS */

      if(conn->handler->protocol & PROTO_FAMILY_HTTP) {
        /*
         * https://tools.ietf.org/html/rfc7230#section-3.1.2
         *
         * The response code is always a three-digit number in HTTP as the spec
         * says. We try to allow any number here, but we cannot make
         * guarantees on future behaviors since it isn't within the protocol.
         */
        char separator;
        nc = sscanf(HEADER1,
                    " HTTP/%1d.%1d%c%3d",
                    &httpversion_major,
                    &conn->httpversion,
                    &separator,
                    &k->httpcode);

        if(nc == 1 && httpversion_major == 2 &&
           1 == sscanf(HEADER1, " HTTP/2 %d", &k->httpcode)) {
          conn->httpversion = 0;
          nc = 4;
          separator = ' ';
        }

        if((nc == 4) && (' ' == separator)) {
          conn->httpversion += 10 * httpversion_major;

          if(k->upgr101 == UPGR101_RECEIVED) {
            /* supposedly upgraded to http2 now */
            if(conn->httpversion != 20)
              infof(data, "Lying server, not serving HTTP/2\n");
          }
          if(conn->httpversion < 20) {
            conn->bundle->multiuse = BUNDLE_NO_MULTIUSE;
            infof(data, "Mark bundle as not supporting multiuse\n");
          }
        }
        else if(!nc) {
          /* this is the real world, not a Nirvana
             NCSA 1.5.x returns this crap when asked for HTTP/1.1
          */
          nc = sscanf(HEADER1, " HTTP %3d", &k->httpcode);
          conn->httpversion = 10;

          /* If user has set option HTTP200ALIASES,
             compare header line against list of aliases
          */
          if(!nc) {
            if(checkhttpprefix(data, k->p, k->hbuflen) == STATUS_DONE) {
              nc = 1;
              k->httpcode = 200;
              conn->httpversion = 10;
            }
          }
        }
        else {
          failf(data, "Unsupported HTTP version in response\n");
          return CURLE_UNSUPPORTED_PROTOCOL;
        }
      }
      else if(conn->handler->protocol & CURLPROTO_RTSP) {
        char separator;
        nc = sscanf(HEADER1,
                    " RTSP/%1d.%1d%c%3d",
                    &rtspversion_major,
                    &conn->rtspversion,
                    &separator,
                    &k->httpcode);
        if((nc == 4) && (' ' == separator)) {
          conn->rtspversion += 10 * rtspversion_major;
          conn->httpversion = 11; /* For us, RTSP acts like HTTP 1.1 */
        }
        else {
          nc = 0;
        }
      }

      if(nc) {
        data->info.httpcode = k->httpcode;

        data->info.httpversion = conn->httpversion;
        if(!data->state.httpversion ||
           data->state.httpversion > conn->httpversion)
          /* store the lowest server version we encounter */
          data->state.httpversion = conn->httpversion;

        /*
         * This code executes as part of processing the header.  As a
         * result, it's not totally clear how to interpret the
         * response code yet as that depends on what other headers may
         * be present.  401 and 407 may be errors, but may be OK
         * depending on how authentication is working.  Other codes
         * are definitely errors, so give up here.
         */
        if(data->state.resume_from && data->set.httpreq == HTTPREQ_GET &&
             k->httpcode == 416) {
          /* "Requested Range Not Satisfiable", just proceed and
             pretend this is no error */
          k->ignorebody = TRUE; /* Avoid appending error msg to good data. */
        }
        else if(data->set.http_fail_on_error && (k->httpcode >= 400) &&
           ((k->httpcode != 401) || !conn->bits.user_passwd) &&
           ((k->httpcode != 407) || !conn->bits.proxy_user_passwd) ) {
          /* serious error, go home! */
          print_http_error(data);
          return CURLE_HTTP_RETURNED_ERROR;
        }

        if(conn->httpversion == 10) {
          /* Default action for HTTP/1.0 must be to close, unless
             we get one of those fancy headers that tell us the
             server keeps it open for us! */
          infof(data, "HTTP 1.0, assume close after body\n");
          connclose(conn, "HTTP/1.0 close after body");
        }
        else if(conn->httpversion == 20 ||
                (k->upgr101 == UPGR101_REQUESTED && k->httpcode == 101)) {
          DEBUGF(infof(data, "HTTP/2 found, allow multiplexing\n"));

          /* HTTP/2 cannot blacklist multiplexing since it is a core
             functionality of the protocol */
          conn->bundle->multiuse = BUNDLE_MULTIPLEX;
        }
        else if(conn->httpversion >= 11 &&
                !conn->bits.close) {
          /* If HTTP version is >= 1.1 and connection is persistent */
          DEBUGF(infof(data,
                       "HTTP 1.1 or later with persistent connection\n"));
        }

        switch(k->httpcode) {
        case 304:
          /* (quote from RFC2616, section 10.3.5): The 304 response
           * MUST NOT contain a message-body, and thus is always
           * terminated by the first empty line after the header
           * fields.  */
          if(data->set.timecondition)
            data->info.timecond = TRUE;
          /* FALLTHROUGH */
        case 204:
          /* (quote from RFC2616, section 10.2.5): The server has
           * fulfilled the request but does not need to return an
           * entity-body ... The 204 response MUST NOT include a
           * message-body, and thus is always terminated by the first
           * empty line after the header fields. */
          k->size = 0;
          k->maxdownload = 0;
          k->ignorecl = TRUE; /* ignore Content-Length headers */
          break;
        default:
          /* nothing */
          break;
        }
      }
      else {
        k->header = FALSE;   /* this is not a header line */
        break;
      }
    }

    result = Curl_convert_from_network(data, k->p, strlen(k->p));
    /* Curl_convert_from_network calls failf if unsuccessful */
    if(result)
      return result;

    /* Check for Content-Length: header lines to get size */
    if(!k->ignorecl && !data->set.ignorecl &&
       checkprefix("Content-Length:", k->p)) {
      curl_off_t contentlength;
      CURLofft offt = curlx_strtoofft(k->p + 15, NULL, 10, &contentlength);

      if(offt == CURL_OFFT_OK) {
        if(data->set.max_filesize &&
           contentlength > data->set.max_filesize) {
          failf(data, "Maximum file size exceeded");
          return CURLE_FILESIZE_EXCEEDED;
        }
        k->size = contentlength;
        k->maxdownload = k->size;
        /* we set the progress download size already at this point
           just to make it easier for apps/callbacks to extract this
           info as soon as possible */
        Curl_pgrsSetDownloadSize(data, k->size);
      }
      else if(offt == CURL_OFFT_FLOW) {
        /* out of range */
        if(data->set.max_filesize) {
          failf(data, "Maximum file size exceeded");
          return CURLE_FILESIZE_EXCEEDED;
        }
        streamclose(conn, "overflow content-length");
        infof(data, "Overflow Content-Length: value!\n");
      }
      else {
        /* negative or just rubbish - bad HTTP */
        failf(data, "Invalid Content-Length: value");
        return CURLE_WEIRD_SERVER_REPLY;
      }
    }
    /* check for Content-Type: header lines to get the MIME-type */
    else if(checkprefix("Content-Type:", k->p)) {
      char *contenttype = Curl_copy_header_value(k->p);
      if(!contenttype)
        return CURLE_OUT_OF_MEMORY;
      if(!*contenttype)
        /* ignore empty data */
        free(contenttype);
      else {
        Curl_safefree(data->info.contenttype);
        data->info.contenttype = contenttype;
      }
    }
    else if((conn->httpversion == 10) &&
            conn->bits.httpproxy &&
            Curl_compareheader(k->p,
                               "Proxy-Connection:", "keep-alive")) {
      /*
       * When a HTTP/1.0 reply comes when using a proxy, the
       * 'Proxy-Connection: keep-alive' line tells us the
       * connection will be kept alive for our pleasure.
       * Default action for 1.0 is to close.
       */
      connkeep(conn, "Proxy-Connection keep-alive"); /* don't close */
      infof(data, "HTTP/1.0 proxy connection set to keep alive!\n");
    }
    else if((conn->httpversion == 11) &&
            conn->bits.httpproxy &&
            Curl_compareheader(k->p,
                               "Proxy-Connection:", "close")) {
      /*
       * We get a HTTP/1.1 response from a proxy and it says it'll
       * close down after this transfer.
       */
      connclose(conn, "Proxy-Connection: asked to close after done");
      infof(data, "HTTP/1.1 proxy connection set close!\n");
    }
    else if((conn->httpversion == 10) &&
            Curl_compareheader(k->p, "Connection:", "keep-alive")) {
      /*
       * A HTTP/1.0 reply with the 'Connection: keep-alive' line
       * tells us the connection will be kept alive for our
       * pleasure.  Default action for 1.0 is to close.
       *
       * [RFC2068, section 19.7.1] */
      connkeep(conn, "Connection keep-alive");
      infof(data, "HTTP/1.0 connection set to keep alive!\n");
    }
    else if(Curl_compareheader(k->p, "Connection:", "close")) {
      /*
       * [RFC 2616, section 8.1.2.1]
       * "Connection: close" is HTTP/1.1 language and means that
       * the connection will close when this request has been
       * served.
       */
      streamclose(conn, "Connection: close used");
    }
    else if(checkprefix("Transfer-Encoding:", k->p)) {
      /* One or more encodings. We check for chunked and/or a compression
         algorithm. */
      /*
       * [RFC 2616, section 3.6.1] A 'chunked' transfer encoding
       * means that the server will send a series of "chunks". Each
       * chunk starts with line with info (including size of the
       * coming block) (terminated with CRLF), then a block of data
       * with the previously mentioned size. There can be any amount
       * of chunks, and a chunk-data set to zero signals the
       * end-of-chunks. */

      result = Curl_build_unencoding_stack(conn, k->p + 18, TRUE);
      if(result)
        return result;
    }
    else if(checkprefix("Content-Encoding:", k->p) &&
            data->set.str[STRING_ENCODING]) {
      /*
       * Process Content-Encoding. Look for the values: identity,
       * gzip, deflate, compress, x-gzip and x-compress. x-gzip and
       * x-compress are the same as gzip and compress. (Sec 3.5 RFC
       * 2616). zlib cannot handle compress.  However, errors are
       * handled further down when the response body is processed
       */
      result = Curl_build_unencoding_stack(conn, k->p + 17, FALSE);
      if(result)
        return result;
    }
    else if(checkprefix("Content-Range:", k->p)) {
      /* Content-Range: bytes [num]-
         Content-Range: bytes: [num]-
         Content-Range: [num]-
         Content-Range: [asterisk]/[total]

         The second format was added since Sun's webserver
         JavaWebServer/1.1.1 obviously sends the header this way!
         The third added since some servers use that!
         The forth means the requested range was unsatisfied.
      */

      char *ptr = k->p + 14;

      /* Move forward until first digit or asterisk */
      while(*ptr && !ISDIGIT(*ptr) && *ptr != '*')
        ptr++;

      /* if it truly stopped on a digit */
      if(ISDIGIT(*ptr)) {
        if(!curlx_strtoofft(ptr, NULL, 10, &k->offset)) {
          if(data->state.resume_from == k->offset)
            /* we asked for a resume and we got it */
            k->content_range = TRUE;
        }
      }
      else
        data->state.resume_from = 0; /* get everything */
    }
#if !defined(CURL_DISABLE_COOKIES)
    else if(data->cookies &&
            checkprefix("Set-Cookie:", k->p)) {
      Curl_share_lock(data, CURL_LOCK_DATA_COOKIE,
                      CURL_LOCK_ACCESS_SINGLE);
      Curl_cookie_add(data,
                      data->cookies, TRUE, FALSE, k->p + 11,
                      /* If there is a custom-set Host: name, use it
                         here, or else use real peer host name. */
                      conn->allocptr.cookiehost?
                      conn->allocptr.cookiehost:conn->host.name,
                      data->state.up.path,
                      (conn->handler->protocol&CURLPROTO_HTTPS)?
                      TRUE:FALSE);
      Curl_share_unlock(data, CURL_LOCK_DATA_COOKIE);
    }
#endif
    else if(checkprefix("Last-Modified:", k->p) &&
            (data->set.timecondition || data->set.get_filetime) ) {
      time_t secs = time(NULL);
      k->timeofdoc = curl_getdate(k->p + strlen("Last-Modified:"),
                                  &secs);
      if(data->set.get_filetime)
        data->info.filetime = k->timeofdoc;
    }
    else if((checkprefix("WWW-Authenticate:", k->p) &&
             (401 == k->httpcode)) ||
            (checkprefix("Proxy-authenticate:", k->p) &&
             (407 == k->httpcode))) {

      bool proxy = (k->httpcode == 407) ? TRUE : FALSE;
      char *auth = Curl_copy_header_value(k->p);
      if(!auth)
        return CURLE_OUT_OF_MEMORY;

      result = Curl_http_input_auth(conn, proxy, auth);

      free(auth);

      if(result)
        return result;
    }
  #ifdef USE_SPNEGO
    else if(checkprefix("Persistent-Auth", k->p)) {
      struct negotiatedata *negdata = &conn->negotiate;
      struct auth *authp = &data->state.authhost;
      if(authp->picked == CURLAUTH_NEGOTIATE) {
        char *persistentauth = Curl_copy_header_value(k->p);
        if(!persistentauth)
          return CURLE_OUT_OF_MEMORY;
        negdata->noauthpersist = checkprefix("false", persistentauth);
        negdata->havenoauthpersist = TRUE;
        infof(data, "Negotiate: noauthpersist -> %d, header part: %s",
          negdata->noauthpersist, persistentauth);
        free(persistentauth);
      }
    }
  #endif
    else if((k->httpcode >= 300 && k->httpcode < 400) &&
            checkprefix("Location:", k->p) &&
            !data->req.location) {
      /* this is the URL that the server advises us to use instead */
      char *location = Curl_copy_header_value(k->p);
      if(!location)
        return CURLE_OUT_OF_MEMORY;
      if(!*location)
        /* ignore empty data */
        free(location);
      else {
        data->req.location = location;

        if(data->set.http_follow_location) {
          DEBUGASSERT(!data->req.newurl);
          data->req.newurl = strdup(data->req.location); /* clone */
          if(!data->req.newurl)
            return CURLE_OUT_OF_MEMORY;

          /* some cases of POST and PUT etc needs to rewind the data
             stream at this point */
          result = http_perhapsrewind(conn);
          if(result)
            return result;
        }
      }
    }
#ifdef USE_ALTSVC
    /* If enabled, the header is incoming and this is over HTTPS */
    else if(data->asi && checkprefix("Alt-Svc:", k->p) &&
            ((conn->handler->flags & PROTOPT_SSL) ||
#ifdef CURLDEBUG
             /* allow debug builds to circumvent the HTTPS restriction */
             getenv("CURL_ALTSVC_HTTP")
#else
             0
#endif
              )) {
      /* the ALPN of the current request */
      enum alpnid id = (conn->httpversion == 20) ? ALPN_h2 : ALPN_h1;
      result = Curl_altsvc_parse(data, data->asi,
                                 &k->p[ strlen("Alt-Svc:") ],
                                 id, conn->host.name,
                                 curlx_uitous(conn->remote_port));
      if(result)
        return result;
    }
#endif
    else if(conn->handler->protocol & CURLPROTO_RTSP) {
      result = Curl_rtsp_parseheader(conn, k->p);
      if(result)
        return result;
    }

    /*
     * End of header-checks. Write them to the client.
     */

    writetype = CLIENTWRITE_HEADER;
    if(data->set.include_header)
      writetype |= CLIENTWRITE_BODY;

    if(data->set.verbose)
      Curl_debug(data, CURLINFO_HEADER_IN, k->p, (size_t)k->hbuflen);

    result = Curl_client_write(conn, writetype, k->p, k->hbuflen);
    if(result)
      return result;

    data->info.header_size += (long)k->hbuflen;
    data->req.headerbytecount += (long)k->hbuflen;

    /* reset hbufp pointer && hbuflen */
    k->hbufp = data->state.headerbuff;
    k->hbuflen = 0;
  }
  while(*k->str); /* header line within buffer */

  /* We might have reached the end of the header part here, but
     there might be a non-header part left in the end of the read
     buffer. */

  return CURLE_OK;
}